

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tradedbook.cpp
# Opt level: O0

void __thiscall hedg::Traded_Book::Traded_Book(Traded_Book *this)

{
  atomic<int> *paVar1;
  long lVar2;
  float fVar3;
  Traded_Book *local_90;
  Bid local_88;
  int local_80;
  int local_7c;
  int t_idx;
  int i;
  int space;
  float x;
  Traded_Book *this_local;
  int local_60;
  memory_order __b_3;
  atomic<int> *local_58;
  memory_order local_50;
  memory_order local_4c;
  int local_48;
  memory_order __b_2;
  atomic<int> *local_40;
  memory_order local_38;
  memory_order local_34;
  int local_30;
  memory_order __b_1;
  atomic<int> *local_28;
  memory_order local_20;
  memory_order local_1c;
  int local_18;
  memory_order __b;
  atomic<int> *local_10;
  
  local_90 = this;
  _space = this;
  do {
    memset(local_90,0,8);
    std::atomic<hedg::Bid>::atomic(local_90->book);
    local_90 = (Traded_Book *)(local_90->book + 1);
  } while (local_90 != (Traded_Book *)this->ticks);
  this->ticks[4] = 0.2;
  this->ticks[5] = 0.5;
  this->ticks[6] = 1.0;
  this->ticks[7] = 2.0;
  this->ticks[0] = 0.01;
  this->ticks[1] = 0.02;
  this->ticks[2] = 0.05;
  this->ticks[3] = 0.1;
  this->ticks[8] = 5.0;
  this->ticks[9] = 10.0;
  this->indexes[8] = 0xfa;
  this->indexes[9] = 0x104;
  this->indexes[4] = 0xbe;
  this->indexes[5] = 0xd2;
  this->indexes[6] = 0xe6;
  this->indexes[7] = 0xf0;
  this->indexes[0] = 1;
  this->indexes[1] = 100;
  this->indexes[2] = 0x96;
  this->indexes[3] = 0xaa;
  paVar1 = &this->min_price_idx;
  fVar3 = std::numeric_limits<float>::min();
  std::atomic<float>::store(&this->max_price,fVar3,memory_order_seq_cst);
  fVar3 = std::numeric_limits<float>::max();
  std::atomic<float>::store(&this->min_price,fVar3,memory_order_seq_cst);
  fVar3 = std::numeric_limits<float>::min();
  std::atomic<float>::store(&this->max_size,fVar3,memory_order_seq_cst);
  fVar3 = std::numeric_limits<float>::max();
  std::atomic<float>::store(&this->min_size,fVar3,memory_order_seq_cst);
  __b = memory_order_relaxed;
  local_18 = 5;
  local_10 = paVar1;
  local_1c = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_20 = __b;
  if (local_18 == 3) {
    (paVar1->super___atomic_base<int>)._M_i = __b;
  }
  else if (local_18 == 5) {
    LOCK();
    (paVar1->super___atomic_base<int>)._M_i = __b;
    UNLOCK();
  }
  else {
    (paVar1->super___atomic_base<int>)._M_i = __b;
  }
  paVar1 = &this->max_price_idx;
  __b_1 = ~memory_order_relaxed;
  local_30 = 5;
  local_28 = paVar1;
  local_34 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_38 = __b_1;
  if (local_30 == 3) {
    (paVar1->super___atomic_base<int>)._M_i = __b_1;
  }
  else if (local_30 == 5) {
    LOCK();
    (paVar1->super___atomic_base<int>)._M_i = __b_1;
    UNLOCK();
  }
  else {
    (paVar1->super___atomic_base<int>)._M_i = __b_1;
  }
  paVar1 = &this->max_traded_price_idx;
  __b_2 = memory_order_relaxed;
  local_48 = 5;
  local_40 = paVar1;
  local_4c = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_50 = __b_2;
  if (local_48 == 3) {
    (paVar1->super___atomic_base<int>)._M_i = __b_2;
  }
  else if (local_48 == 5) {
    LOCK();
    (paVar1->super___atomic_base<int>)._M_i = __b_2;
    UNLOCK();
  }
  else {
    (paVar1->super___atomic_base<int>)._M_i = __b_2;
  }
  paVar1 = &this->min_traded_price_idx;
  __b_3 = memory_order_relaxed;
  local_60 = 5;
  local_58 = paVar1;
  this_local._4_4_ = std::operator&(memory_order_seq_cst,__memory_order_mask);
  this_local._0_4_ = __b_3;
  if (local_60 == 3) {
    (paVar1->super___atomic_base<int>)._M_i = __b_3;
  }
  else if (local_60 == 5) {
    LOCK();
    (paVar1->super___atomic_base<int>)._M_i = __b_3;
    UNLOCK();
  }
  else {
    (paVar1->super___atomic_base<int>)._M_i = __b_3;
  }
  i = 0x3f8147ae;
  t_idx = 0;
  local_80 = 0;
  for (local_7c = 0; local_7c < 0x15e; local_7c = local_7c + 1) {
    if (((float)i < 1.0) || (2.0 <= (float)i)) {
      if (((float)i < 2.0) || (3.0 <= (float)i)) {
        if (((float)i < 3.0) || (4.0 <= (float)i)) {
          if (((float)i < 4.0) || (6.0 <= (float)i)) {
            if (((float)i < 6.0) || (10.0 <= (float)i)) {
              if (((float)i < 10.0) || (20.0 <= (float)i)) {
                if (((float)i < 20.0) || (30.0 <= (float)i)) {
                  if (((float)i < 30.0) || (50.0 <= (float)i)) {
                    if (((float)i < 50.0) || (100.0 <= (float)i)) {
                      if ((100.0 <= (float)i) && ((float)i < 1000.0)) {
                        local_80 = 9;
                      }
                    }
                    else {
                      local_80 = 8;
                    }
                  }
                  else {
                    local_80 = 7;
                  }
                }
                else {
                  local_80 = 6;
                }
              }
              else {
                local_80 = 5;
              }
            }
            else {
              local_80 = 4;
            }
          }
          else {
            local_80 = 3;
          }
        }
        else {
          local_80 = 2;
        }
      }
      else {
        local_80 = 1;
      }
    }
    else {
      local_80 = 0;
    }
    i = (int)round_2dp((float)i);
    lVar2 = (long)local_7c;
    Bid::Bid(&local_88,(float)i,0.0);
    std::atomic<hedg::Bid>::store(this->book + lVar2,local_88,memory_order_seq_cst);
    i = (int)(this->ticks[local_80] + (float)i);
  }
  return;
}

Assistant:

Traded_Book::Traded_Book() {

	max_price.store(std::numeric_limits<float>::min());
	min_price.store(std::numeric_limits<float>::max());
	max_size.store(std::numeric_limits<float>::min());
	min_size.store(std::numeric_limits<float>::max());
	min_price_idx.store(0);
	max_price_idx.store(-1);
	max_traded_price_idx.store(0);
	min_traded_price_idx.store(0);

	float x = 1.01;
	int space = 0;
	for (int i = 0, t_idx = 0; i < 350; ++i) {

		if (1 <= x && x < 2)
			t_idx = 0;
		else if (2 <= x && x < 3)
			t_idx = 1;
		else if (3 <= x && x < 4)
			t_idx = 2;
		else if (4 <= x && x < 6)
			t_idx = 3;
		else if (6 <= x && x < 10)
			t_idx = 4;
		else if (10 <= x && x < 20)
			t_idx = 5;
		else if (20 <= x && x < 30)
			t_idx = 6;
		else if (30 <= x && x < 50)
			t_idx = 7;
		else if (50 <= x && x < 100)
			t_idx = 8;
		else if (100 <= x && x < 1000)
			t_idx = 9;

		x = round_2dp(x);
		book[i].store(Bid(x, 0));
		x += ticks[t_idx];
	}
}